

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlDocument::CopyTo(TiXmlDocument *this,TiXmlDocument *target)

{
  int iVar1;
  undefined4 extraout_var;
  TiXmlNode *local_20;
  TiXmlNode *node;
  TiXmlDocument *target_local;
  TiXmlDocument *this_local;
  
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  target->error = (bool)(this->error & 1);
  target->errorId = this->errorId;
  TiXmlString::operator=(&target->errorDesc,&this->errorDesc);
  target->tabsize = this->tabsize;
  target->errorLocation = this->errorLocation;
  target->useMicrosoftBOM = (bool)(this->useMicrosoftBOM & 1);
  for (local_20 = (this->super_TiXmlNode).firstChild; local_20 != (TiXmlNode *)0x0;
      local_20 = TiXmlNode::NextSibling(local_20)) {
    iVar1 = (*(local_20->super_TiXmlBase)._vptr_TiXmlBase[0x10])();
    TiXmlNode::LinkEndChild(&target->super_TiXmlNode,(TiXmlNode *)CONCAT44(extraout_var,iVar1));
  }
  return;
}

Assistant:

void TiXmlDocument::CopyTo(TiXmlDocument* target) const {
	TiXmlNode::CopyTo(target);

	target->error = error;
	target->errorId = errorId;
	target->errorDesc = errorDesc;
	target->tabsize = tabsize;
	target->errorLocation = errorLocation;
	target->useMicrosoftBOM = useMicrosoftBOM;

	TiXmlNode* node = 0;
	for (node = firstChild; node; node = node->NextSibling()) {
		target->LinkEndChild(node->Clone());
	}
}